

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

bool __thiscall
tinyusdz::tydra::RenderSceneConverter::BuildNodeHierarchy
          (RenderSceneConverter *this,RenderSceneConverterEnv *env,XformNode *root)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  XformNode *rootNode;
  pointer node;
  string defaultRootNode;
  Node root_node;
  string local_230;
  vector<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_> *local_210;
  pointer local_208;
  RenderSceneConverterEnv *local_200;
  long *local_1f8;
  size_t local_1f0;
  long local_1e8 [2];
  Node local_1d8;
  
  local_1f8 = local_1e8;
  pcVar2 = (env->stage->stage_metas).defaultPrim.str_._M_dataplus._M_p;
  local_200 = env;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,pcVar2,
             pcVar2 + (env->stage->stage_metas).defaultPrim.str_._M_string_length);
  this->default_node = -1;
  node = (root->children).
         super__Vector_base<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>
         ._M_impl.super__Vector_impl_data._M_start;
  local_208 = (root->children).
              super__Vector_base<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (node != local_208) {
    paVar1 = &local_1d8.prim_name.field_2;
    local_210 = &this->root_nodes;
    do {
      local_1d8.prim_name._M_string_length = 0;
      local_1d8.prim_name.field_2._M_local_buf[0] = '\0';
      local_1d8.abs_path._M_dataplus._M_p = (pointer)&local_1d8.abs_path.field_2;
      local_1d8.abs_path._M_string_length = 0;
      local_1d8.abs_path.field_2._M_local_buf[0] = '\0';
      local_1d8.display_name._M_dataplus._M_p = (pointer)&local_1d8.display_name.field_2;
      local_1d8.display_name._M_string_length = 0;
      local_1d8.display_name.field_2._M_local_buf[0] = '\0';
      local_1d8.nodeType = Xform;
      local_1d8.id = -1;
      local_1d8.children.
      super__Vector_base<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1d8.children.
      super__Vector_base<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d8.children.
      super__Vector_base<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d8.local_matrix.m[0][0] = 1.0;
      local_1d8.local_matrix.m[0][3] = 0.0;
      local_1d8.local_matrix.m[1][0] = 0.0;
      local_1d8.local_matrix.m[0][1] = 0.0;
      local_1d8.local_matrix.m[0][2] = 0.0;
      local_1d8.local_matrix.m[1][1] = 1.0;
      local_1d8.local_matrix.m[2][0] = 0.0;
      local_1d8.local_matrix.m[2][1] = 0.0;
      local_1d8.local_matrix.m[1][2] = 0.0;
      local_1d8.local_matrix.m[1][3] = 0.0;
      local_1d8.local_matrix.m[2][2] = 1.0;
      local_1d8.local_matrix.m[3][1] = 0.0;
      local_1d8.local_matrix.m[3][2] = 0.0;
      local_1d8.local_matrix.m[2][3] = 0.0;
      local_1d8.local_matrix.m[3][0] = 0.0;
      local_1d8.local_matrix.m[3][3] = 1.0;
      local_1d8.global_matrix.m[0][0] = 1.0;
      local_1d8.global_matrix.m[0][3] = 0.0;
      local_1d8.global_matrix.m[1][0] = 0.0;
      local_1d8.global_matrix.m[0][1] = 0.0;
      local_1d8.global_matrix.m[0][2] = 0.0;
      local_1d8.global_matrix.m[1][1] = 1.0;
      local_1d8.global_matrix.m[2][0] = 0.0;
      local_1d8.global_matrix.m[2][1] = 0.0;
      local_1d8.global_matrix.m[1][2] = 0.0;
      local_1d8.global_matrix.m[1][3] = 0.0;
      local_1d8.global_matrix.m[2][2] = 1.0;
      local_1d8.global_matrix.m[3][1] = 0.0;
      local_1d8.global_matrix.m[3][2] = 0.0;
      local_1d8.global_matrix.m[2][3] = 0.0;
      local_1d8.global_matrix.m[3][0] = 0.0;
      local_1d8.global_matrix.m[3][3] = 1.0;
      local_1d8.has_resetXform = false;
      local_1d8.node_animations.
      super__Vector_base<tinyusdz::tydra::AnimationChannel,_std::allocator<tinyusdz::tydra::AnimationChannel>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1d8.handle = 0;
      local_1d8.node_animations.
      super__Vector_base<tinyusdz::tydra::AnimationChannel,_std::allocator<tinyusdz::tydra::AnimationChannel>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d8.node_animations.
      super__Vector_base<tinyusdz::tydra::AnimationChannel,_std::allocator<tinyusdz::tydra::AnimationChannel>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      local_1d8.prim_name._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"");
      BuildNodeHierarchyImpl(this,local_200,&local_230,node,&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if (local_1f0 == (node->element_name)._M_string_length) {
        if (local_1f0 != 0) {
          iVar3 = bcmp(local_1f8,(node->element_name)._M_dataplus._M_p,local_1f0);
          if (iVar3 != 0) goto LAB_0035ef5c;
        }
        this->default_node =
             (int)((ulong)((long)(this->root_nodes).
                                 super__Vector_base<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->root_nodes).
                                super__Vector_base<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x73ecade3;
      }
LAB_0035ef5c:
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_230,"/",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)node);
      StringAndIdMap::add(&this->root_nodeMap,&local_230,
                          ((long)(this->root_nodes).
                                 super__Vector_base<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->root_nodes).
                                 super__Vector_base<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x21cfb2b78c13521d);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      ::std::vector<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>::push_back
                (local_210,&local_1d8);
      ::std::
      vector<tinyusdz::tydra::AnimationChannel,_std::allocator<tinyusdz::tydra::AnimationChannel>_>
      ::~vector(&local_1d8.node_animations);
      ::std::vector<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>::~vector
                (&local_1d8.children);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.display_name._M_dataplus._M_p != &local_1d8.display_name.field_2) {
        operator_delete(local_1d8.display_name._M_dataplus._M_p,
                        CONCAT71(local_1d8.display_name.field_2._M_allocated_capacity._1_7_,
                                 local_1d8.display_name.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.abs_path._M_dataplus._M_p != &local_1d8.abs_path.field_2) {
        operator_delete(local_1d8.abs_path._M_dataplus._M_p,
                        CONCAT71(local_1d8.abs_path.field_2._M_allocated_capacity._1_7_,
                                 local_1d8.abs_path.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.prim_name._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d8.prim_name._M_dataplus._M_p,
                        CONCAT71(local_1d8.prim_name.field_2._M_allocated_capacity._1_7_,
                                 local_1d8.prim_name.field_2._M_local_buf[0]) + 1);
      }
      node = node + 1;
    } while (node != local_208);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  return true;
}

Assistant:

bool RenderSceneConverter::BuildNodeHierarchy(
    const RenderSceneConverterEnv &env, const XformNode &root) {
  std::string defaultRootNode = env.stage.metas().defaultPrim.str();

  default_node = -1;

  for (const auto &rootNode : root.children) {
    Node root_node;
    if (!BuildNodeHierarchyImpl(env, /* root */ "", rootNode, root_node)) {
      return false;
    }

    if (defaultRootNode == rootNode.element_name) {
      default_node = int(root_nodes.size());
    }

    root_nodeMap.add("/" + rootNode.element_name, root_nodes.size());
    root_nodes.push_back(root_node);
  }

  return true;
}